

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::continueHandshake(TlsCryptographOpenSSL *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  element_type *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  NPNContext NVar7;
  QSslConfiguration *configuration;
  qint64 maxSize;
  SslMode mode;
  QTcpSocket *plainSocket;
  EVP_PKEY *key;
  uint proto_len;
  uchar *proto;
  QSslContext *in_stack_fffffffffffffea8;
  QArrayDataPointer<char> *in_stack_fffffffffffffeb0;
  QSslSocketPrivate *pQVar8;
  QSslContext *in_stack_fffffffffffffeb8;
  SSL *in_stack_fffffffffffffec0;
  QSslContext *in_stack_fffffffffffffec8;
  NextProtocolNegotiationStatus NStack_fc;
  NextProtocolNegotiationStatus NStack_ec;
  QSslKey local_c0 [8];
  void *local_b8;
  undefined1 local_b0 [24];
  QByteArray local_98;
  uint local_7c;
  char *local_78;
  QArrayDataPointer<char> local_70;
  undefined1 local_58 [24];
  undefined1 local_40 [48];
  QSslConfiguration local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = (long *)QSslSocketPrivate::plainTcpSocket();
  iVar2 = QSslSocketPrivate::tlsMode();
  lVar5 = QSslSocketPrivate::maxReadBufferSize();
  if (lVar5 != 0) {
    (**(code **)(*plVar4 + 0x108))(plVar4,lVar5);
  }
  iVar3 = q_SSL_session_reused((SSL *)in_stack_fffffffffffffea8);
  if (iVar3 != 0) {
    QTlsBackend::setPeerSessionShared(*(QSslSocketPrivate **)(in_RDI + 0x18),true);
  }
  QSslSocket::sslConfiguration();
  uVar6 = QSslConfiguration::testSslOption((SslOption)&local_10);
  if ((uVar6 & 1) == 0) {
    std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1537aa);
    bVar1 = QSslContext::cacheSession(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (bVar1) {
      uVar6 = QSslConfiguration::testSslOption((SslOption)&local_10);
      if ((uVar6 & 1) == 0) {
        std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1537f7);
        QSslContext::sessionASN1(in_stack_fffffffffffffea8);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x153814);
        QByteArray::~QByteArray((QByteArray *)0x153827);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
          std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x153848);
          QSslContext::sessionASN1(in_stack_fffffffffffffea8);
          QTlsBackend::setSessionAsn1(pQVar8,(QByteArray *)local_40);
          QByteArray::~QByteArray((QByteArray *)0x153877);
        }
        pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
        this_00 = std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x15388e);
        iVar3 = QSslContext::sessionTicketLifeTimeHint(this_00);
        QTlsBackend::setSessionLifetimeHint(pQVar8,iVar3);
      }
    }
    else {
      std::__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffeb8)
      ;
    }
  }
  pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
  std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1538bd)
  ;
  NVar7 = QSslContext::npnContext(in_stack_fffffffffffffeb8);
  NStack_ec = NVar7.status;
  QTlsBackend::setAlpnStatus(pQVar8,NStack_ec);
  std::__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QSslContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1538eb)
  ;
  NVar7 = QSslContext::npnContext(in_stack_fffffffffffffeb8);
  NStack_fc = NVar7.status;
  if (NStack_fc == NextProtocolNegotiationUnsupported) {
    pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
    QArrayDataPointer<char>::QArrayDataPointer(&local_70,(Data *)0x0,"http/1.1",8);
    QByteArray::QByteArray
              ((QByteArray *)in_stack_fffffffffffffeb0,(DataPointer *)in_stack_fffffffffffffea8);
    QTlsBackend::setNegotiatedProtocol(pQVar8,(QByteArray *)local_58);
    QByteArray::~QByteArray((QByteArray *)0x153963);
    QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffffeb0);
    iVar3 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  }
  else {
    local_78 = (char *)0x0;
    local_7c = 0;
    q_SSL_get0_alpn_selected
              ((SSL *)in_stack_fffffffffffffeb0,(uchar **)in_stack_fffffffffffffea8,(uint *)0x1539aa
              );
    if ((local_7c != 0) && (iVar2 == 1)) {
      QTlsBackend::setAlpnStatus
                (*(QSslSocketPrivate **)(in_RDI + 0x18),NextProtocolNegotiationNegotiated);
    }
    if (local_7c == 0) {
      q_SSL_get0_next_proto_negotiated
                ((SSL *)in_stack_fffffffffffffeb0,(uchar **)in_stack_fffffffffffffea8,
                 (uint *)0x1539f9);
    }
    iVar3 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    if (local_7c == 0) {
      in_stack_fffffffffffffeb8 = *(QSslContext **)(in_RDI + 0x18);
      QByteArray::QByteArray((QByteArray *)0x153a6b);
      QTlsBackend::setNegotiatedProtocol
                ((QSslSocketPrivate *)in_stack_fffffffffffffeb8,(QByteArray *)local_b0);
      QByteArray::~QByteArray((QByteArray *)0x153a8a);
    }
    else {
      pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
      QByteArray::QByteArray(&local_98,local_78,(ulong)local_7c);
      QTlsBackend::setNegotiatedProtocol(pQVar8,(QByteArray *)&local_98);
      QByteArray::~QByteArray((QByteArray *)0x153a4e);
    }
  }
  if (iVar2 == 1) {
    local_b8 = (void *)0xaaaaaaaaaaaaaaaa;
    lVar5 = q_SSL_ctrl((SSL *)in_stack_fffffffffffffeb8,iVar3,(long)in_stack_fffffffffffffea8,
                       (void *)0x153acb);
    if (lVar5 != 0) {
      pQVar8 = *(QSslSocketPrivate **)(in_RDI + 0x18);
      QSslKey::QSslKey(local_c0,local_b8,PublicKey);
      QTlsBackend::setEphemeralKey(pQVar8,local_c0);
      QSslKey::~QSslKey(local_c0);
    }
  }
  QSslSocketPrivate::setEncrypted(SUB81(*(undefined8 *)(in_RDI + 0x18),0));
  QSslSocket::encrypted();
  uVar6 = QSslSocketPrivate::isAutoStartingHandshake();
  if (((uVar6 & 1) != 0) && (uVar6 = QSslSocketPrivate::isPendingClose(), (uVar6 & 1) != 0)) {
    QSslSocketPrivate::setPendingClose(SUB81(*(undefined8 *)(in_RDI + 0x18),0));
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x100))();
  }
  QSslConfiguration::~QSslConfiguration(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::continueHandshake()
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    auto *plainSocket = d->plainTcpSocket();
    Q_ASSERT(plainSocket);

    const auto mode = d->tlsMode();

    // if we have a max read buffer size, reset the plain socket's to match
    if (const auto maxSize = d->maxReadBufferSize())
        plainSocket->setReadBufferSize(maxSize);

    if (q_SSL_session_reused(ssl))
        QTlsBackend::setPeerSessionShared(d, true);

#ifdef QT_DECRYPT_SSL_TRAFFIC
    if (q_SSL_get_session(ssl)) {
        size_t master_key_len = q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl), nullptr, 0);
        size_t client_random_len = q_SSL_get_client_random(ssl, nullptr, 0);
        QByteArray masterKey(int(master_key_len), Qt::Uninitialized); // Will not overflow
        QByteArray clientRandom(int(client_random_len), Qt::Uninitialized); // Will not overflow

        q_SSL_SESSION_get_master_key(q_SSL_get_session(ssl),
                                     reinterpret_cast<unsigned char*>(masterKey.data()),
                                     masterKey.size());
        q_SSL_get_client_random(ssl, reinterpret_cast<unsigned char *>(clientRandom.data()),
                                clientRandom.size());

        QByteArray debugLineClientRandom("CLIENT_RANDOM ");
        debugLineClientRandom.append(clientRandom.toHex().toUpper());
        debugLineClientRandom.append(" ");
        debugLineClientRandom.append(masterKey.toHex().toUpper());
        debugLineClientRandom.append("\n");

        QString sslKeyFile = QDir::tempPath() + "/qt-ssl-keys"_L1;
        QFile file(sslKeyFile);
        if (!file.open(QIODevice::Append))
            qCWarning(lcTlsBackend) << "could not open file" << sslKeyFile << "for appending";
        if (!file.write(debugLineClientRandom))
            qCWarning(lcTlsBackend) << "could not write to file" << sslKeyFile;
        file.close();
    } else {
        qCWarning(lcTlsBackend, "could not decrypt SSL traffic");
    }
#endif // QT_DECRYPT_SSL_TRAFFIC

    const auto &configuration = q->sslConfiguration();
    // Cache this SSL session inside the QSslContext
    if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionSharing))) {
        if (!sslContextPointer->cacheSession(ssl)) {
            sslContextPointer.reset(); // we could not cache the session
        } else {
            // Cache the session for permanent usage as well
            if (!(configuration.testSslOption(QSsl::SslOptionDisableSessionPersistence))) {
                if (!sslContextPointer->sessionASN1().isEmpty())
                    QTlsBackend::setSessionAsn1(d, sslContextPointer->sessionASN1());
                QTlsBackend::setSessionLifetimeHint(d, sslContextPointer->sessionTicketLifeTimeHint());
            }
        }
    }

#if !defined(OPENSSL_NO_NEXTPROTONEG)

    QTlsBackend::setAlpnStatus(d, sslContextPointer->npnContext().status);
    if (sslContextPointer->npnContext().status == QSslConfiguration::NextProtocolNegotiationUnsupported) {
        // we could not agree -> be conservative and use HTTP/1.1
        // T.P.: I have to admit, this is a really strange notion of 'conservative',
        // given the protocol-neutral nature of ALPN/NPN.
        QTlsBackend::setNegotiatedProtocol(d, QByteArrayLiteral("http/1.1"));
    } else {
        const unsigned char *proto = nullptr;
        unsigned int proto_len = 0;

        q_SSL_get0_alpn_selected(ssl, &proto, &proto_len);
        if (proto_len && mode == QSslSocket::SslClientMode) {
            // Client does not have a callback that sets it ...
            QTlsBackend::setAlpnStatus(d, QSslConfiguration::NextProtocolNegotiationNegotiated);
        }

        if (!proto_len) { // Test if NPN was more lucky ...
            q_SSL_get0_next_proto_negotiated(ssl, &proto, &proto_len);
        }

        if (proto_len)
            QTlsBackend::setNegotiatedProtocol(d, QByteArray(reinterpret_cast<const char *>(proto), proto_len));
        else
            QTlsBackend::setNegotiatedProtocol(d,{});
    }
#endif // !defined(OPENSSL_NO_NEXTPROTONEG)

    if (mode == QSslSocket::SslClientMode) {
        EVP_PKEY *key;
        if (q_SSL_get_server_tmp_key(ssl, &key))
            QTlsBackend::setEphemeralKey(d, QSslKey(key, QSsl::PublicKey));
    }

    d->setEncrypted(true);
    emit q->encrypted();
    if (d->isAutoStartingHandshake() && d->isPendingClose()) {
        d->setPendingClose(false);
        q->disconnectFromHost();
    }
}